

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitSwitch(AsmJSByteCodeGenerator *this,ParseNodeSwitch *pnode)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  ByteCodeLabel BVar4;
  undefined4 *puVar5;
  AsmJsCompilationException *pAVar6;
  ParseNodeInt *pPVar7;
  AsmJsType local_7c;
  EmitExpressionInfo local_78;
  EmitExpressionInfo *local_70;
  EmitExpressionInfo *caseBodyInfo;
  EmitExpressionInfo **local_60;
  EmitExpressionInfo *caseExprInfo;
  ParseNode *caseExpr;
  ParseNodeCase *pnodeCase;
  RegSlot regVal;
  EmitExpressionInfo local_38;
  EmitExpressionInfo *local_30;
  EmitExpressionInfo *valInfo;
  ParseNodeSwitch *pPStack_20;
  BOOL fHasDefault;
  ParseNodeSwitch *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  
  valInfo._4_4_ = 0;
  pPStack_20 = pnode;
  pnode_local = (ParseNodeSwitch *)this;
  if (pnode->pnodeVal == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x92d,"(pnode->pnodeVal != __null)","pnode->pnodeVal != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_38 = Emit(this,pPStack_20->pnodeVal);
  local_30 = &local_38;
  bVar2 = AsmJsType::isSigned(&local_38.type);
  if (!bVar2) {
    pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar6,L"Switch value must be type Signed, FixNum");
    __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
  }
  pnodeCase._0_4_ = GetAndReleaseUnaryLocations<int>(this,local_30);
  StartStatement(this,(ParseNode *)pPStack_20);
  AsmJsByteCodeWriter::AsmReg2
            (&this->mWriter,BeginSwitch_Int,(RegSlot)pnodeCase,
             (local_30->super_EmitInfoBase).location);
  EndStatement(this,(ParseNode *)pPStack_20);
  caseExpr = (ParseNode *)pPStack_20->pnodeCases;
  do {
    if (caseExpr == (ParseNode *)0x0) {
      if (valInfo._4_4_ == 0) {
        if (((pPStack_20->super_ParseNodeStmt).emitLabels & 1U) == 0) {
          BVar4 = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
          (pPStack_20->super_ParseNodeStmt).breakLabel = BVar4;
        }
        AsmJsByteCodeWriter::AsmBr
                  (&this->mWriter,(pPStack_20->super_ParseNodeStmt).breakLabel,EndSwitch_Int);
      }
      else {
        AsmJsByteCodeWriter::AsmBr(&this->mWriter,pPStack_20->pnodeDefault->labelCase,EndSwitch_Int)
        ;
      }
      for (caseExpr = (ParseNode *)pPStack_20->pnodeCases; caseExpr != (ParseNode *)0x0;
          caseExpr = *(ParseNode **)(caseExpr + 2)) {
        AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,caseExpr[3].ichLim);
        local_78 = Emit(this,*(ParseNode **)(caseExpr + 3));
        local_70 = &local_78;
        AsmJsFunc::ReleaseLocationGeneric(this->mFunction,local_70);
      }
      AsmJsFunc::ReleaseTmpRegister<int>(this->mFunction,(RegSlot)pnodeCase);
      if ((valInfo._4_4_ == 0) || (((pPStack_20->super_ParseNodeStmt).emitLabels & 1U) != 0)) {
        AsmJsByteCodeWriter::MarkAsmJsLabel
                  (&this->mWriter,(pPStack_20->super_ParseNodeStmt).breakLabel);
      }
      AsmJsType::AsmJsType(&local_7c,Void);
      EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,&local_7c);
      return (EmitExpressionInfo)this_local;
    }
    cVar3 = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
    caseExpr[3].ichLim = cVar3;
    if ((ParseNodeCase *)caseExpr == pPStack_20->pnodeDefault) {
      valInfo._4_4_ = 1;
    }
    else {
      caseExprInfo = *(EmitExpressionInfo **)&caseExpr[2].ichLim;
      if (((ParseNode *)caseExprInfo)->nop == knopInt) {
        pPVar7 = ParseNode::AsParseNodeInt((ParseNode *)caseExprInfo);
        if (1 < pPVar7->lw >> 0x1f) goto LAB_00d51dcb;
      }
      else {
LAB_00d51dcb:
        bVar2 = ParserWrapper::IsMinInt((ParseNode *)caseExprInfo);
        if (!bVar2) {
          pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar6,L"Switch case value must be int in the range [-2^31, 2^31)");
          __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
        }
      }
      caseBodyInfo = (EmitExpressionInfo *)Emit(this,*(ParseNode **)&caseExpr[2].ichLim);
      local_60 = &caseBodyInfo;
      AsmJsByteCodeWriter::AsmBrReg2
                (&this->mWriter,Case_Int,caseExpr[3].ichLim,(RegSlot)pnodeCase,caseBodyInfo._0_4_);
    }
    caseExpr = *(ParseNode **)(caseExpr + 2);
  } while( true );
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitSwitch( ParseNodeSwitch * pnode )
    {
        BOOL fHasDefault = false;
        Assert( pnode->pnodeVal != NULL );
        const EmitExpressionInfo& valInfo = Emit( pnode->pnodeVal );

        if( !valInfo.type.isSigned() )
        {
            throw AsmJsCompilationException( _u("Switch value must be type Signed, FixNum") );
        }

        RegSlot regVal = GetAndReleaseUnaryLocations<int>( &valInfo );
        StartStatement(pnode);
        mWriter.AsmReg2(OpCodeAsmJs::BeginSwitch_Int, regVal, valInfo.location);
        EndStatement(pnode);

        // TODO: if all cases are compile-time constants, emit a switch statement in the byte
        // code so the BE can optimize it.

        ParseNodeCase *pnodeCase;
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            // Jump to the first case body if this one doesn't match. Make sure any side-effects of the case
            // expression take place regardless.
            pnodeCase->labelCase = mWriter.DefineLabel();
            if( pnodeCase == pnode->pnodeDefault )
            {
                fHasDefault = true;
                continue;
            }
            ParseNode* caseExpr = pnodeCase->pnodeExpr;
            if ((caseExpr->nop != knopInt || (caseExpr->AsParseNodeInt()->lw >> 31) > 1) && !ParserWrapper::IsMinInt(caseExpr))
            {
                throw AsmJsCompilationException( _u("Switch case value must be int in the range [-2^31, 2^31)") );
            }

            const EmitExpressionInfo& caseExprInfo = Emit( pnodeCase->pnodeExpr );
            mWriter.AsmBrReg2( OpCodeAsmJs::Case_Int, pnodeCase->labelCase, regVal, caseExprInfo.location );
            // do not need to release location because int constants cannot be released
        }

        // No explicit case value matches. Jump to the default arm (if any) or break out altogether.
        if( fHasDefault )
        {
            mWriter.AsmBr( pnode->pnodeDefault->labelCase, OpCodeAsmJs::EndSwitch_Int );
        }
        else
        {
            if( !pnode->emitLabels )
            {
                pnode->breakLabel = mWriter.DefineLabel();
            }
            mWriter.AsmBr( pnode->breakLabel, OpCodeAsmJs::EndSwitch_Int );
        }
        // Now emit the case arms to which we jump on matching a case value.
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            mWriter.MarkAsmJsLabel( pnodeCase->labelCase );
            const EmitExpressionInfo& caseBodyInfo = Emit( pnodeCase->pnodeBody );
            mFunction->ReleaseLocationGeneric( &caseBodyInfo );
        }

        mFunction->ReleaseTmpRegister<int>( regVal );

        if( !fHasDefault || pnode->emitLabels )
        {
            mWriter.MarkAsmJsLabel( pnode->breakLabel );
        }

        return EmitExpressionInfo( AsmJsType::Void );
    }